

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O3

IOTHUB_CLIENT_CORE_LL_HANDLE
IoTHubClientCore_LL_CreateFromConnectionString
          (char *connectionString,IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol)

{
  bool bVar1;
  _Bool use_dev_auth;
  int iVar2;
  IOTHUB_CLIENT_CONFIG *client_config;
  STRING_HANDLE handle;
  STRING_TOKENIZER_HANDLE tokenizer;
  STRING_HANDLE output;
  STRING_HANDLE output_00;
  STRING_HANDLE output_01;
  STRING_HANDLE output_02;
  LOGGER_LOG p_Var3;
  char *pcVar4;
  STRING_TOKENIZER_HANDLE tokenizer_00;
  STRING_HANDLE handle_00;
  IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *pIVar5;
  char *pcVar6;
  STRING_HANDLE local_98;
  STRING_HANDLE local_90;
  STRING_HANDLE local_88;
  STRING_HANDLE local_80;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  
  if (connectionString == (char *)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0;
    }
    pcVar6 = "Input parameter is NULL: connectionString";
    iVar2 = 0x56c;
LAB_0011e614:
    (*p_Var3)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
              ,"IoTHubClientCore_LL_CreateFromConnectionString",iVar2,1,pcVar6);
    return (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0;
  }
  if (protocol == (IOTHUB_CLIENT_TRANSPORT_PROVIDER)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0;
    }
    pcVar6 = "Input parameter is NULL: protocol";
    iVar2 = 0x571;
    goto LAB_0011e614;
  }
  client_config = (IOTHUB_CLIENT_CONFIG *)calloc(1,0x38);
  if (client_config == (IOTHUB_CLIENT_CONFIG *)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0;
    }
    pcVar6 = "Malloc failed";
    iVar2 = 0x579;
    goto LAB_0011e614;
  }
  client_config->protocol = protocol;
  handle = STRING_construct(connectionString);
  if (handle == (STRING_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      pIVar5 = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)0x0;
    }
    else {
      pIVar5 = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)0x0;
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_CreateFromConnectionString",0x591,1,
                "Error constructing connection String");
    }
    goto LAB_0011eee9;
  }
  tokenizer = STRING_TOKENIZER_create(handle);
  if (tokenizer == (STRING_TOKENIZER_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      pcVar6 = "Error creating Tokenizer";
      iVar2 = 0x596;
LAB_0011e6c6:
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_CreateFromConnectionString",iVar2,1,pcVar6);
    }
LAB_0011e6d6:
    pIVar5 = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)0x0;
LAB_0011eed7:
    STRING_delete(handle);
  }
  else {
    output = STRING_new();
    if (output == (STRING_HANDLE)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        pcVar6 = "Error creating Token String";
        iVar2 = 0x59b;
        goto LAB_0011e6c6;
      }
      goto LAB_0011e6d6;
    }
    output_00 = STRING_new();
    if (output_00 == (STRING_HANDLE)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                  ,"IoTHubClientCore_LL_CreateFromConnectionString",0x5a0,1,
                  "Error creating Value String");
      }
      pIVar5 = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)0x0;
      local_98 = (STRING_HANDLE)0x0;
      handle_00 = (STRING_HANDLE)0x0;
    }
    else {
      output_01 = STRING_new();
      if (output_01 == (STRING_HANDLE)0x0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                    ,"IoTHubClientCore_LL_CreateFromConnectionString",0x5a5,1,
                    "Error creating HostName String");
        }
        handle_00 = (STRING_HANDLE)0x0;
        local_98 = (STRING_HANDLE)0x0;
        pIVar5 = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)0x0;
      }
      else {
        output_02 = STRING_new();
        if (output_02 == (STRING_HANDLE)0x0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                      ,"IoTHubClientCore_LL_CreateFromConnectionString",0x5aa,1,
                      "Error creating HostSuffix String");
          }
          pIVar5 = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)0x0;
          local_98 = (STRING_HANDLE)0x0;
          handle_00 = (STRING_HANDLE)0x0;
        }
        else {
          iVar2 = STRING_TOKENIZER_get_next_token(tokenizer,output,"=");
          if (iVar2 == 0) {
            local_60 = (char *)0x0;
            local_68 = (char *)0x0;
            local_58 = (char *)0x0;
            local_50 = (char *)0x0;
            pcVar6 = (char *)0x0;
            local_80 = (STRING_HANDLE)0x0;
            local_88 = (STRING_HANDLE)0x0;
            local_90 = (STRING_HANDLE)0x0;
            local_98 = (STRING_HANDLE)0x0;
            handle_00 = (STRING_HANDLE)0x0;
            bVar1 = false;
            use_dev_auth = false;
            do {
              iVar2 = STRING_TOKENIZER_get_next_token(tokenizer,output_00,";");
              if (iVar2 != 0) {
                p_Var3 = xlogging_get_log_function();
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  pcVar4 = "Tokenizer error";
                  iVar2 = 0x5b5;
LAB_0011ece8:
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                            ,"IoTHubClientCore_LL_CreateFromConnectionString",iVar2,1,pcVar4);
                }
                break;
              }
              pcVar4 = STRING_c_str(output);
              iVar2 = strcmp(pcVar4,"HostName");
              if (iVar2 == 0) {
                tokenizer_00 = STRING_TOKENIZER_create(output_00);
                if (tokenizer_00 == (STRING_TOKENIZER_HANDLE)0x0) {
                  p_Var3 = xlogging_get_log_function();
                  if (p_Var3 != (LOGGER_LOG)0x0) {
                    pcVar4 = "Error creating Tokenizer";
                    iVar2 = 0x5c2;
                    goto LAB_0011ece8;
                  }
                }
                else {
                  iVar2 = STRING_TOKENIZER_get_next_token(tokenizer_00,output_01,".");
                  if (iVar2 == 0) {
                    pcVar6 = STRING_c_str(output_01);
                    client_config->iotHubName = pcVar6;
                    iVar2 = STRING_TOKENIZER_get_next_token(tokenizer_00,output_02,";");
                    if (iVar2 == 0) {
                      local_50 = STRING_c_str(output_02);
                      client_config->iotHubSuffix = local_50;
                      STRING_TOKENIZER_destroy(tokenizer_00);
                      goto LAB_0011eae9;
                    }
                    p_Var3 = xlogging_get_log_function();
                    if (p_Var3 != (LOGGER_LOG)0x0) {
                      iVar2 = 0x5d2;
                      goto LAB_0011ebf1;
                    }
                  }
                  else {
                    p_Var3 = xlogging_get_log_function();
                    if (p_Var3 != (LOGGER_LOG)0x0) {
                      iVar2 = 0x5c9;
LAB_0011ebf1:
                      (*p_Var3)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                                ,"IoTHubClientCore_LL_CreateFromConnectionString",iVar2,1,
                                "Tokenizer error");
                    }
                  }
                  STRING_TOKENIZER_destroy(tokenizer_00);
                }
                break;
              }
              iVar2 = strcmp(pcVar4,"DeviceId");
              if (iVar2 == 0) {
                local_80 = STRING_clone(output_00);
                if (local_80 == (STRING_HANDLE)0x0) {
                  p_Var3 = xlogging_get_log_function();
                  if (p_Var3 != (LOGGER_LOG)0x0) {
                    pcVar4 = "Failure cloning device id string";
                    local_80 = (STRING_HANDLE)0x0;
                    iVar2 = 0x5e7;
                    goto LAB_0011ece8;
                  }
                  local_80 = (STRING_HANDLE)0x0;
                  break;
                }
                local_58 = STRING_c_str(local_80);
                client_config->deviceId = local_58;
              }
              else {
                iVar2 = strcmp(pcVar4,"SharedAccessKey");
                if (iVar2 == 0) {
                  local_88 = STRING_clone(output_00);
                  if (local_88 == (STRING_HANDLE)0x0) {
                    p_Var3 = xlogging_get_log_function();
                    if (p_Var3 != (LOGGER_LOG)0x0) {
                      pcVar4 = "Failure cloning device key string";
                      local_88 = (STRING_HANDLE)0x0;
                      iVar2 = 0x5f4;
                      goto LAB_0011ece8;
                    }
                    local_88 = (STRING_HANDLE)0x0;
                    break;
                  }
                  local_60 = STRING_c_str(local_88);
                  client_config->deviceKey = local_60;
                }
                else {
                  iVar2 = strcmp(pcVar4,"SharedAccessSignature");
                  if (iVar2 == 0) {
                    local_90 = STRING_clone(output_00);
                    if (local_90 == (STRING_HANDLE)0x0) {
                      p_Var3 = xlogging_get_log_function();
                      if (p_Var3 != (LOGGER_LOG)0x0) {
                        pcVar4 = "Failure cloning device sasToken string";
                        local_90 = (STRING_HANDLE)0x0;
                        iVar2 = 0x601;
                        goto LAB_0011ece8;
                      }
                      local_90 = (STRING_HANDLE)0x0;
                      break;
                    }
                    local_68 = STRING_c_str(local_90);
                    client_config->deviceSasToken = local_68;
                  }
                  else {
                    iVar2 = strcmp(pcVar4,"x509");
                    if (iVar2 == 0) {
                      pcVar4 = STRING_c_str(output_00);
                      iVar2 = strcmp(pcVar4,"true");
                      if (iVar2 != 0) {
                        p_Var3 = xlogging_get_log_function();
                        if (p_Var3 != (LOGGER_LOG)0x0) {
                          pcVar4 = 
                          "x509 option has wrong value, the only acceptable one is \"true\"";
                          iVar2 = 0x609;
                          goto LAB_0011ece8;
                        }
                        break;
                      }
                      bVar1 = true;
                    }
                    else {
                      iVar2 = strcmp(pcVar4,"UseProvisioning");
                      if (iVar2 == 0) {
                        pcVar4 = STRING_c_str(output_00);
                        iVar2 = strcmp(pcVar4,"true");
                        if (iVar2 != 0) {
                          p_Var3 = xlogging_get_log_function();
                          if (p_Var3 != (LOGGER_LOG)0x0) {
                            pcVar4 = 
                            "provisioning option has wrong value, the only acceptable one is \"true\""
                            ;
                            iVar2 = 0x615;
LAB_0011efb0:
                            (*p_Var3)(AZ_LOG_ERROR,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                                      ,"IoTHubClientCore_LL_CreateFromConnectionString",iVar2,1,
                                      pcVar4);
                          }
                          break;
                        }
                        use_dev_auth = true;
                      }
                      else {
                        iVar2 = strcmp(pcVar4,"GatewayHostName");
                        if (iVar2 == 0) {
                          local_98 = STRING_clone(output_00);
                          if (local_98 == (STRING_HANDLE)0x0) {
                            p_Var3 = xlogging_get_log_function();
                            if (p_Var3 != (LOGGER_LOG)0x0) {
                              pcVar4 = "Failure cloning protocol Gateway Name";
                              local_98 = (STRING_HANDLE)0x0;
                              iVar2 = 0x627;
                              goto LAB_0011efb0;
                            }
                            local_98 = (STRING_HANDLE)0x0;
                            break;
                          }
                          pcVar4 = STRING_c_str(local_98);
                          client_config->protocolGatewayHostName = pcVar4;
                        }
                        else {
                          iVar2 = strcmp(pcVar4,"ModuleId");
                          if (iVar2 == 0) {
                            handle_00 = STRING_clone(output_00);
                            if (handle_00 == (STRING_HANDLE)0x0) {
                              p_Var3 = xlogging_get_log_function();
                              if (p_Var3 != (LOGGER_LOG)0x0) {
                                pcVar4 = "Failure cloning moduleId string";
                                handle_00 = (STRING_HANDLE)0x0;
                                iVar2 = 0x630;
                                goto LAB_0011efb0;
                              }
                              handle_00 = (STRING_HANDLE)0x0;
                              break;
                            }
                          }
                          else {
                            p_Var3 = xlogging_get_log_function();
                            if (p_Var3 != (LOGGER_LOG)0x0) {
                              (*p_Var3)(AZ_LOG_ERROR,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                                        ,"IoTHubClientCore_LL_CreateFromConnectionString",0x637,1,
                                        "Unknown token <%s> in connection string.  Ignoring error and continuing to parse"
                                        ,pcVar4);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
LAB_0011eae9:
              iVar2 = STRING_TOKENIZER_get_next_token(tokenizer,output,"=");
            } while (iVar2 == 0);
            if (pcVar6 == (char *)0x0) goto LAB_0011e548;
            if (local_50 == (char *)0x0) {
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 != (LOGGER_LOG)0x0) {
                pcVar6 = "iotHubSuffix is not found";
                iVar2 = 0x644;
                goto LAB_0011e578;
              }
              goto LAB_0011ee50;
            }
            if (local_58 == (char *)0x0) {
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0011ee50;
              pcVar6 = "deviceId is not found";
              iVar2 = 0x649;
              goto LAB_0011e578;
            }
            if (bVar1 || use_dev_auth) {
              if (local_68 != (char *)0x0 || local_60 != (char *)0x0) {
LAB_0011ed35:
                p_Var3 = xlogging_get_log_function();
                if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0011ee50;
                pcVar6 = "invalid combination of x509, provisioning, deviceSasToken and deviceKey";
                iVar2 = 0x651;
                goto LAB_0011e578;
              }
            }
            else if ((local_68 == (char *)0x0) == (local_60 == (char *)0x0)) goto LAB_0011ed35;
            pcVar6 = STRING_c_str(handle_00);
            pIVar5 = initialize_iothub_client
                               (client_config,(IOTHUB_CLIENT_DEVICE_CONFIG *)0x0,use_dev_auth,pcVar6
                               );
            if (pIVar5 == (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)0x0) {
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0011ee50;
              pcVar6 = "IoTHubClientCore_LL_Create failed";
              iVar2 = 0x659;
              goto LAB_0011e578;
            }
          }
          else {
            local_80 = (STRING_HANDLE)0x0;
            local_88 = (STRING_HANDLE)0x0;
            local_90 = (STRING_HANDLE)0x0;
            local_98 = (STRING_HANDLE)0x0;
            handle_00 = (STRING_HANDLE)0x0;
LAB_0011e548:
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 == (LOGGER_LOG)0x0) {
LAB_0011ee50:
              pIVar5 = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)0x0;
            }
            else {
              pcVar6 = "iotHubName is not found";
              iVar2 = 0x63f;
LAB_0011e578:
              pIVar5 = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)0x0;
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                        ,"IoTHubClientCore_LL_CreateFromConnectionString",iVar2,1,pcVar6);
            }
          }
          if (local_90 != (STRING_HANDLE)0x0) {
            STRING_delete(local_90);
          }
          if (local_88 != (STRING_HANDLE)0x0) {
            STRING_delete(local_88);
          }
          if (local_80 != (STRING_HANDLE)0x0) {
            STRING_delete(local_80);
          }
          STRING_delete(output_02);
        }
        STRING_delete(output_01);
      }
      STRING_delete(output_00);
    }
    STRING_delete(output);
    STRING_delete(handle);
    if (local_98 != (STRING_HANDLE)0x0) {
      STRING_delete(local_98);
    }
    handle = handle_00;
    if (handle_00 != (STRING_HANDLE)0x0) goto LAB_0011eed7;
  }
  if (tokenizer != (STRING_TOKENIZER_HANDLE)0x0) {
    STRING_TOKENIZER_destroy(tokenizer);
  }
LAB_0011eee9:
  free(client_config);
  return pIVar5;
}

Assistant:

IOTHUB_CLIENT_CORE_LL_HANDLE IoTHubClientCore_LL_CreateFromConnectionString(const char* connectionString, IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol)
{
    IOTHUB_CLIENT_CORE_LL_HANDLE result;

    if (connectionString == NULL)
    {
        LogError("Input parameter is NULL: connectionString");
        result = NULL;
    }
    else if (protocol == NULL)
    {
        LogError("Input parameter is NULL: protocol");
        result = NULL;
    }
    else
    {
        IOTHUB_CLIENT_CONFIG* config = (IOTHUB_CLIENT_CONFIG*) malloc(sizeof(IOTHUB_CLIENT_CONFIG));
        if (config == NULL)
        {
            LogError("Malloc failed");
            result = NULL;
        }
        else
        {
            STRING_TOKENIZER_HANDLE tokenizer1 = NULL;
            STRING_HANDLE connString = NULL;
            STRING_HANDLE tokenString = NULL;
            STRING_HANDLE valueString = NULL;
            STRING_HANDLE hostNameString = NULL;
            STRING_HANDLE hostSuffixString = NULL;
            STRING_HANDLE deviceIdString = NULL;
            STRING_HANDLE deviceKeyString = NULL;
            STRING_HANDLE deviceSasTokenString = NULL;
            STRING_HANDLE protocolGateway = NULL;
            STRING_HANDLE moduleId = NULL;

            memset(config, 0, sizeof(*config));
            config->protocol = protocol;

            config->protocolGatewayHostName = NULL;

            if ((connString = STRING_construct(connectionString)) == NULL)
            {
                LogError("Error constructing connection String");
                result = NULL;
            }
            else if ((tokenizer1 = STRING_TOKENIZER_create(connString)) == NULL)
            {
                LogError("Error creating Tokenizer");
                result = NULL;
            }
            else if ((tokenString = STRING_new()) == NULL)
            {
                LogError("Error creating Token String");
                result = NULL;
            }
            else if ((valueString = STRING_new()) == NULL)
            {
                LogError("Error creating Value String");
                result = NULL;
            }
            else if ((hostNameString = STRING_new()) == NULL)
            {
                LogError("Error creating HostName String");
                result = NULL;
            }
            else if ((hostSuffixString = STRING_new()) == NULL)
            {
                LogError("Error creating HostSuffix String");
                result = NULL;
            }
            else
            {
                int isx509found = 0;
                bool use_provisioning = false;
                while ((STRING_TOKENIZER_get_next_token(tokenizer1, tokenString, "=") == 0))
                {
                    if (STRING_TOKENIZER_get_next_token(tokenizer1, valueString, ";") != 0)
                    {
                        LogError("Tokenizer error");
                        break;
                    }
                    else
                    {
                        if (tokenString != NULL)
                        {
                            const char* s_token = STRING_c_str(tokenString);
                            if (strcmp(s_token, HOSTNAME_TOKEN) == 0)
                            {
                                STRING_TOKENIZER_HANDLE tokenizer2 = NULL;
                                if ((tokenizer2 = STRING_TOKENIZER_create(valueString)) == NULL)
                                {
                                    LogError("Error creating Tokenizer");
                                    break;
                                }
                                else
                                {
                                    if (STRING_TOKENIZER_get_next_token(tokenizer2, hostNameString, ".") != 0)
                                    {
                                        LogError("Tokenizer error");
                                        STRING_TOKENIZER_destroy(tokenizer2);
                                        break;
                                    }
                                    else
                                    {
                                        config->iotHubName = STRING_c_str(hostNameString);
                                        if (STRING_TOKENIZER_get_next_token(tokenizer2, hostSuffixString, ";") != 0)
                                        {
                                            LogError("Tokenizer error");
                                            STRING_TOKENIZER_destroy(tokenizer2);
                                            break;
                                        }
                                        else
                                        {
                                            config->iotHubSuffix = STRING_c_str(hostSuffixString);
                                        }
                                    }
                                    STRING_TOKENIZER_destroy(tokenizer2);
                                }
                            }
                            else if (strcmp(s_token, DEVICEID_TOKEN) == 0)
                            {
                                deviceIdString = STRING_clone(valueString);
                                if (deviceIdString != NULL)
                                {
                                    config->deviceId = STRING_c_str(deviceIdString);
                                }
                                else
                                {
                                    LogError("Failure cloning device id string");
                                    break;
                                }
                            }
                            else if (strcmp(s_token, DEVICEKEY_TOKEN) == 0)
                            {
                                deviceKeyString = STRING_clone(valueString);
                                if (deviceKeyString != NULL)
                                {
                                    config->deviceKey = STRING_c_str(deviceKeyString);
                                }
                                else
                                {
                                    LogError("Failure cloning device key string");
                                    break;
                                }
                            }
                            else if (strcmp(s_token, DEVICESAS_TOKEN) == 0)
                            {
                                deviceSasTokenString = STRING_clone(valueString);
                                if (deviceSasTokenString != NULL)
                                {
                                    config->deviceSasToken = STRING_c_str(deviceSasTokenString);
                                }
                                else
                                {
                                    LogError("Failure cloning device sasToken string");
                                    break;
                                }
                            }
                            else if (strcmp(s_token, X509_TOKEN) == 0)
                            {
                                if (strcmp(STRING_c_str(valueString), X509_TOKEN_ONLY_ACCEPTABLE_VALUE) != 0)
                                {
                                    LogError("x509 option has wrong value, the only acceptable one is \"true\"");
                                    break;
                                }
                                else
                                {
                                    isx509found = 1;
                                }
                            }
                            else if (strcmp(s_token, PROVISIONING_TOKEN) == 0)
                            {
                                if (strcmp(STRING_c_str(valueString), PROVISIONING_ACCEPTABLE_VALUE) != 0)
                                {
                                    LogError("provisioning option has wrong value, the only acceptable one is \"true\"");
                                    break;
                                }
                                else
                                {
                                    use_provisioning = 1;
                                }
                            }

                            else if (strcmp(s_token, PROTOCOL_GATEWAY_HOST_TOKEN) == 0)
                            {
                                protocolGateway = STRING_clone(valueString);
                                if (protocolGateway != NULL)
                                {
                                    config->protocolGatewayHostName = STRING_c_str(protocolGateway);
                                }
                                else
                                {
                                    LogError("Failure cloning protocol Gateway Name");
                                    break;
                                }
                            }
                            else if (strcmp(s_token, MODULE_ID_TOKEN) == 0)
                            {
                                moduleId = STRING_clone(valueString);
                                if (moduleId == NULL)
                                {
                                    LogError("Failure cloning moduleId string");
                                    break;
                                }
                            }
                            else
                            {
                                // If we get an unknown token, log it to error stream but do not cause a fatal error.
                                LogError("Unknown token <%s> in connection string.  Ignoring error and continuing to parse", s_token);
                            }
                        }
                    }
                }
                /* parsing is done - check the result */
                if (config->iotHubName == NULL)
                {
                    LogError("iotHubName is not found");
                    result = NULL;
                }
                else if (config->iotHubSuffix == NULL)
                {
                    LogError("iotHubSuffix is not found");
                    result = NULL;
                }
                else if (config->deviceId == NULL)
                {
                    LogError("deviceId is not found");
                    result = NULL;
                }
                else if (!(
                    ((!use_provisioning && !isx509found) && (config->deviceSasToken == NULL) ^ (config->deviceKey == NULL)) ||
                    ((use_provisioning || isx509found) && (config->deviceSasToken == NULL) && (config->deviceKey == NULL))
                    ))
                {
                    LogError("invalid combination of x509, provisioning, deviceSasToken and deviceKey");
                    result = NULL;
                }
                else
                {
                    result = initialize_iothub_client(config, NULL, use_provisioning, STRING_c_str(moduleId));
                    if (result == NULL)
                    {
                        LogError("IoTHubClientCore_LL_Create failed");
                    }
                    else
                    {
                        /*return as is*/
                    }
                }
            }
            if (deviceSasTokenString != NULL)
                STRING_delete(deviceSasTokenString);
            if (deviceKeyString != NULL)
                STRING_delete(deviceKeyString);
            if (deviceIdString != NULL)
                STRING_delete(deviceIdString);
            if (hostSuffixString != NULL)
                STRING_delete(hostSuffixString);
            if (hostNameString != NULL)
                STRING_delete(hostNameString);
            if (valueString != NULL)
                STRING_delete(valueString);
            if (tokenString != NULL)
                STRING_delete(tokenString);
            if (connString != NULL)
                STRING_delete(connString);
            if (protocolGateway != NULL)
                STRING_delete(protocolGateway);
            if (moduleId != NULL)
                STRING_delete(moduleId);

            if (tokenizer1 != NULL)
                STRING_TOKENIZER_destroy(tokenizer1);

            free(config);
        }
    }
    return result;
}